

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeSPRRegListOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = Val & 0xff;
  uVar4 = Val >> 8 & 0x1f;
  uVar1 = uVar4 + (Val & 0xff);
  DVar2 = MCDisassembler_Success;
  if (0x20 < uVar1 || (Val & 0xff) == 0) {
    if (0x20 < uVar1) {
      uVar5 = 0x20 - uVar4;
    }
    uVar5 = uVar5 + (uVar5 == 0);
    DVar2 = MCDisassembler_SoftFail;
  }
  MCOperand_CreateReg0(Inst,(uint)SPRDecoderTable[uVar4]);
  if (uVar5 != 1) {
    lVar3 = 0;
    do {
      if ((uVar4 ^ (uint)lVar3) == 0x1f) {
        return MCDisassembler_Fail;
      }
      MCOperand_CreateReg0(Inst,(uint)*(ushort *)((ulong)uVar4 * 2 + 0x1cdc92 + lVar3 * 2));
      lVar3 = lVar3 + 1;
    } while (uVar5 - 1 != (int)lVar3);
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeSPRRegListOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned i;
	unsigned Vd = fieldFromInstruction_4(Val, 8, 5);
	unsigned regs = fieldFromInstruction_4(Val, 0, 8);

	// In case of unpredictable encoding, tweak the operands.
	if (regs == 0 || (Vd + regs) > 32) {
		regs = Vd + regs > 32 ? 32 - Vd : regs;
		regs = (1u > regs? 1u : regs);
		S = MCDisassembler_SoftFail;
	}

	if (!Check(&S, DecodeSPRRegisterClass(Inst, Vd, Address, Decoder)))
		return MCDisassembler_Fail;
	for (i = 0; i < (regs - 1); ++i) {
		if (!Check(&S, DecodeSPRRegisterClass(Inst, ++Vd, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}